

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cpp
# Opt level: O2

int rs_read_object_reference
              (FILE *inf,list<ItemThing_*,_std::allocator<ItemThing_*>_> *list,ItemThing **item)

{
  ItemThing *in_RAX;
  int i;
  undefined8 uStack_18;
  
  if ((read_error == '\0') && ((format_error & 1) == 0)) {
    uStack_18 = in_RAX;
    rs_read_int(inf,(int *)((long)&uStack_18 + 4));
    in_RAX = get_list_item(&player.pack,uStack_18._4_4_);
    (list->super__List_base<ItemThing_*,_std::allocator<ItemThing_*>_>)._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)in_RAX;
  }
  return (int)in_RAX;
}

Assistant:

static int rs_read_object_reference(FILE *inf, std::list<ItemThing*>& list, ItemThing **item)
{
    int i;
    
    if (read_error || format_error)
        return(READSTAT);

    rs_read_int(inf, &i);

    *item = get_list_item(list, i);
            
    return(READSTAT);
}